

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

uintwide_t<24U,_unsigned_char,_void,_false> * __thiscall
math::wide_integer::uintwide_t<65536U,_unsigned_int,_std::allocator<unsigned_int>,_false>::
operator%=(uintwide_t<65536U,_unsigned_int,_std::allocator<unsigned_int>,_false> *this,
          uintwide_t<24U,_unsigned_char,_void,_false> *other)

{
  bool bVar1;
  bool bVar2;
  iterator first;
  iterator last;
  undefined8 uStack_98;
  uintwide_t<24U,_unsigned_char,_void,_false> remainder;
  undefined8 uStack_78;
  local_unsigned_wide_type remainder_unsigned;
  uintwide_t<24U,_unsigned_char,_void,_false> local_50 [2];
  local_unsigned_wide_type b;
  uintwide_t<65536U,_unsigned_int,_std::allocator<unsigned_int>,_false> local_38 [8];
  local_unsigned_wide_type a;
  bool denom_was_neg;
  bool numer_was_neg;
  uintwide_t<24U,_unsigned_char,_void,_false> *other_local;
  uintwide_t<24U,_unsigned_char,_void,_false> *this_local;
  
  if (this == (uintwide_t<65536U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)other) {
    first = util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::
            begin((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int> *)
                  this);
    last = util::dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>::end
                     ((dynamic_array<unsigned_int,_std::allocator<unsigned_int>,_unsigned_int,_int>
                       *)this);
    detail::fill_unsafe<unsigned_int*,unsigned_int>(first,last,0);
  }
  else {
    bVar1 = is_neg<false>((uintwide_t<24U,_unsigned_char,_void,_false> *)this,
                          (enable_if_t<(_false),_int> *)0x0);
    bVar2 = is_neg<false>(other,(enable_if_t<(_false),_int> *)0x0);
    if ((bVar1) || (bVar2)) {
      uintwide_t(local_38,(uintwide_t<24U,_unsigned_char,_void,_false> *)this);
      uintwide_t((uintwide_t<65536U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)local_50,
                 other);
      if (bVar1) {
        negate(local_38);
      }
      if (bVar2) {
        negate((uintwide_t<65536U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)local_50);
      }
      uStack_78 = 0;
      _remainder_unsigned = 0;
      uintwide_t((uintwide_t<65536U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)&uStack_78
                );
      eval_divide_knuth(local_38,local_50,(uintwide_t<24U,_unsigned_char,_void,_false> *)&uStack_78)
      ;
      if (bVar1) {
        negate((uintwide_t<65536U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)&uStack_78);
      }
      detail::fixed_dynamic_array<unsigned_int,_2048U,_std::allocator<unsigned_int>_>::operator=
                ((fixed_dynamic_array<unsigned_int,_2048U,_std::allocator<unsigned_int>_> *)this,
                 (fixed_static_array<unsigned_char,_3U> *)&uStack_78);
      ~uintwide_t((uintwide_t<65536U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
                  &uStack_78);
      ~uintwide_t((uintwide_t<65536U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)local_50)
      ;
      ~uintwide_t(local_38);
    }
    else {
      uStack_98 = 0;
      _remainder = 0;
      uintwide_t((uintwide_t<65536U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)&uStack_98
                );
      eval_divide_knuth(this,other,(uintwide_t<24U,_unsigned_char,_void,_false> *)&uStack_98);
      detail::fixed_dynamic_array<unsigned_int,_2048U,_std::allocator<unsigned_int>_>::operator=
                ((fixed_dynamic_array<unsigned_int,_2048U,_std::allocator<unsigned_int>_> *)this,
                 (fixed_static_array<unsigned_char,_3U> *)&uStack_98);
      ~uintwide_t((uintwide_t<65536U,_unsigned_int,_std::allocator<unsigned_int>,_false> *)
                  &uStack_98);
    }
  }
  return (uintwide_t<24U,_unsigned_char,_void,_false> *)this;
}

Assistant:

constexpr auto operator%=(const uintwide_t& other) -> uintwide_t&
    {
      if(this == &other)
      {
        detail::fill_unsafe(values.begin(), values.end(), static_cast<limb_type>(UINT8_C(0))); // LCOV_EXCL_LINE
      }
      else
      {
        // Unary modulus function.
        const auto numer_was_neg = is_neg(*this);
        const auto denom_was_neg = is_neg(other);

        if(numer_was_neg || denom_was_neg)
        {
          using local_unsigned_wide_type = uintwide_t<Width2, limb_type, AllocatorType, false>;

          local_unsigned_wide_type a(*this);
          local_unsigned_wide_type b(other);

          if(numer_was_neg) { a.negate(); }
          if(denom_was_neg) { b.negate(); }

          local_unsigned_wide_type remainder_unsigned { };

          a.eval_divide_knuth(b, &remainder_unsigned);

          // The sign of the remainder follows the sign of the denominator.
          if(numer_was_neg) { remainder_unsigned.negate(); }

          values = remainder_unsigned.values;
        }
        else
        {
          uintwide_t remainder { };

          eval_divide_knuth(other, &remainder);

          values = remainder.values;
        }
      }

      return *this;
    }